

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void flush_before_commit_multi_writers_test(void)

{
  fdb_status fVar1;
  int iVar2;
  size_t metalen;
  void *pvVar3;
  fdb_file_handle *in_stack_fffffffffffff938;
  void *in_stack_fffffffffffff940;
  fdb_doc **in_stack_fffffffffffff948;
  void *in_stack_fffffffffffff950;
  fdb_doc **in_stack_fffffffffffff958;
  size_t in_stack_fffffffffffff960;
  undefined1 local_5b0 [144];
  fdb_kvs_config *in_stack_fffffffffffffae0;
  char *in_stack_fffffffffffffae8;
  fdb_kvs_handle **in_stack_fffffffffffffaf0;
  fdb_file_handle *in_stack_fffffffffffffaf8;
  char local_4b8 [8];
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_status status;
  fdb_doc *rdoc;
  fdb_doc **doc;
  fdb_kvs_handle *db2;
  fdb_kvs_handle *db1;
  fdb_file_handle *dbfile2;
  fdb_file_handle *dbfile1;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  memcpy(&kvs_config.custom_cmp_param,local_5b0,0xf8);
  fdb_get_default_kvs_config();
  fdb_open((fdb_file_handle **)bodybuf._24_8_,(char *)bodybuf._16_8_,(fdb_config *)bodybuf._8_8_);
  fdb_kvs_open(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
               in_stack_fffffffffffffae0);
  for (n = 0; n < 10; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf(local_4b8,"body%d",(ulong)(uint)n);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    pvVar3 = (void *)0x118787;
    metalen = strlen(local_4b8);
    fdb_doc_create(in_stack_fffffffffffff948,in_stack_fffffffffffff940,
                   (size_t)in_stack_fffffffffffff938,pvVar3,metalen,(void *)0x1187be,
                   in_stack_fffffffffffff960);
    fdb_set(db2,*(fdb_doc **)(&stack0xfffffffffffff938 + (long)n * 8));
  }
  fdb_commit(in_stack_fffffffffffff938,'\0');
  fdb_open((fdb_file_handle **)bodybuf._24_8_,(char *)bodybuf._16_8_,(fdb_config *)bodybuf._8_8_);
  fdb_kvs_open(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
               in_stack_fffffffffffffae0);
  for (n = 0; n < 5; n = n + 1) {
    sprintf(bodybuf + 0xf8,"meta2%d",(ulong)(uint)n);
    sprintf(local_4b8,"body2%d(db2)",(ulong)(uint)n);
    strlen(bodybuf + 0xf8);
    strlen(local_4b8);
    fdb_doc_update(in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                   (size_t)in_stack_fffffffffffff948,in_stack_fffffffffffff940,
                   (size_t)in_stack_fffffffffffff938);
    fdb_set((fdb_kvs_handle *)doc,*(fdb_doc **)(&stack0xfffffffffffff938 + (long)n * 8));
  }
  for (n = 5; n < 10; n = n + 1) {
    sprintf(bodybuf + 0xf8,"meta2%d",(ulong)(uint)n);
    sprintf(local_4b8,"body2%d(db1)",(ulong)(uint)n);
    strlen(bodybuf + 0xf8);
    strlen(local_4b8);
    fdb_doc_update(in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                   (size_t)in_stack_fffffffffffff948,in_stack_fffffffffffff940,
                   (size_t)in_stack_fffffffffffff938);
    fdb_set(db2,*(fdb_doc **)(&stack0xfffffffffffff938 + (long)n * 8));
  }
  n = 0;
  while( true ) {
    if (9 < n) {
      fdb_commit(in_stack_fffffffffffff938,'\0');
      fdb_commit(in_stack_fffffffffffff938,'\0');
      n = 0;
      while( true ) {
        if (9 < n) {
          fdb_close(in_stack_fffffffffffff938);
          fdb_close(in_stack_fffffffffffff938);
          for (n = 0; n < 10; n = n + 1) {
            fdb_doc_free((fdb_doc *)0x11933b);
          }
          fdb_shutdown();
          memleak_end();
          if (flush_before_commit_multi_writers_test::__test_pass == 0) {
            fprintf(_stderr,"%s FAILED\n","flush before commit with multi writers test");
          }
          else {
            fprintf(_stderr,"%s PASSED\n","flush before commit with multi writers test");
          }
          return;
        }
        sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
        sprintf(bodybuf + 0xf8,"meta2%d",(ulong)(uint)n);
        if (n < 5) {
          sprintf(local_4b8,"body2%d(db2)",(ulong)(uint)n);
        }
        else {
          sprintf(local_4b8,"body2%d(db1)",(ulong)(uint)n);
        }
        pvVar3 = (void *)0x118f40;
        strlen(metabuf + 0xf8);
        fdb_doc_create(in_stack_fffffffffffff948,in_stack_fffffffffffff940,
                       (size_t)in_stack_fffffffffffff938,pvVar3,0,(void *)0x118f6d,
                       in_stack_fffffffffffff960);
        fVar1 = fdb_get(db2,(fdb_doc *)0x0);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xe92);
          flush_before_commit_multi_writers_test::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xe92,"void flush_before_commit_multi_writers_test()");
          }
        }
        iVar2 = memcmp(bodybuf + 0xf8,pvRam0000000000000038,sRam0000000000000008);
        if (iVar2 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvRam0000000000000038,
                  bodybuf + 0xf8,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xe93);
          flush_before_commit_multi_writers_test::__test_pass = 0;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xe93,"void flush_before_commit_multi_writers_test()");
        }
        iVar2 = memcmp(local_4b8,pvRam0000000000000040,sRam0000000000000010);
        if (iVar2 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvRam0000000000000040,
                  local_4b8,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xe94);
          flush_before_commit_multi_writers_test::__test_pass = 0;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xe94,"void flush_before_commit_multi_writers_test()");
        }
        fdb_doc_free((fdb_doc *)0x119104);
        pvVar3 = (void *)0x119129;
        strlen(metabuf + 0xf8);
        fdb_doc_create(in_stack_fffffffffffff948,in_stack_fffffffffffff940,
                       (size_t)in_stack_fffffffffffff938,pvVar3,0,(void *)0x119156,
                       in_stack_fffffffffffff960);
        fVar1 = fdb_get((fdb_kvs_handle *)doc,(fdb_doc *)0x0);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xe9c);
          flush_before_commit_multi_writers_test::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xe9c,"void flush_before_commit_multi_writers_test()");
          }
        }
        iVar2 = memcmp(bodybuf + 0xf8,pvRam0000000000000038,sRam0000000000000008);
        if (iVar2 != 0) break;
        iVar2 = memcmp(local_4b8,pvRam0000000000000040,sRam0000000000000010);
        if (iVar2 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvRam0000000000000040,
                  local_4b8,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xe9e);
          flush_before_commit_multi_writers_test::__test_pass = 0;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xe9e,"void flush_before_commit_multi_writers_test()");
        }
        fdb_doc_free((fdb_doc *)0x1192ed);
        n = n + 1;
      }
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvRam0000000000000038,
              bodybuf + 0xf8,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xe9d);
      flush_before_commit_multi_writers_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xe9d,"void flush_before_commit_multi_writers_test()");
    }
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta2%d",(ulong)(uint)n);
    if (n < 5) {
      sprintf(local_4b8,"body2%d(db2)",(ulong)(uint)n);
    }
    else {
      sprintf(local_4b8,"body2%d(db1)",(ulong)(uint)n);
    }
    pvVar3 = (void *)0x118ab5;
    strlen(metabuf + 0xf8);
    fdb_doc_create(in_stack_fffffffffffff948,in_stack_fffffffffffff940,
                   (size_t)in_stack_fffffffffffff938,pvVar3,0,(void *)0x118ae2,
                   in_stack_fffffffffffff960);
    fVar1 = fdb_get(db2,(fdb_doc *)0x0);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xe71);
      flush_before_commit_multi_writers_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xe71,"void flush_before_commit_multi_writers_test()");
      }
    }
    iVar2 = memcmp(bodybuf + 0xf8,pvRam0000000000000038,sRam0000000000000008);
    if (iVar2 != 0) break;
    iVar2 = memcmp(local_4b8,pvRam0000000000000040,sRam0000000000000010);
    if (iVar2 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvRam0000000000000040,local_4b8,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xe73);
      flush_before_commit_multi_writers_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xe73,"void flush_before_commit_multi_writers_test()");
    }
    fdb_doc_free((fdb_doc *)0x118c79);
    pvVar3 = (void *)0x118c9e;
    strlen(metabuf + 0xf8);
    fdb_doc_create(in_stack_fffffffffffff948,in_stack_fffffffffffff940,
                   (size_t)in_stack_fffffffffffff938,pvVar3,0,(void *)0x118ccb,
                   in_stack_fffffffffffff960);
    fVar1 = fdb_get((fdb_kvs_handle *)doc,(fdb_doc *)0x0);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xe7b);
      flush_before_commit_multi_writers_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xe7b,"void flush_before_commit_multi_writers_test()");
      }
    }
    iVar2 = memcmp(bodybuf + 0xf8,pvRam0000000000000038,sRam0000000000000008);
    if (iVar2 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvRam0000000000000038,
              bodybuf + 0xf8,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xe7c);
      flush_before_commit_multi_writers_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xe7c,"void flush_before_commit_multi_writers_test()");
    }
    iVar2 = memcmp(local_4b8,pvRam0000000000000040,sRam0000000000000010);
    if (iVar2 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvRam0000000000000040,local_4b8,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xe7d);
      flush_before_commit_multi_writers_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xe7d,"void flush_before_commit_multi_writers_test()");
    }
    fdb_doc_free((fdb_doc *)0x118e62);
    n = n + 1;
  }
  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvRam0000000000000038,bodybuf + 0xf8
          ,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
          ,0xe72);
  flush_before_commit_multi_writers_test::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xe72,"void flush_before_commit_multi_writers_test()");
}

Assistant:

void flush_before_commit_multi_writers_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile1, *dbfile2;
    fdb_kvs_handle *db1, *db2;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fconfig = fdb_get_default_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 8;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;
    fconfig.wal_flush_before_commit = true;

    kvs_config = fdb_get_default_kvs_config();

    // open db
    fdb_open(&dbfile1, "dummy1", &fconfig);
    fdb_kvs_open(dbfile1, &db1, NULL, &kvs_config);

    // create & insert docs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                                (void*)metabuf, strlen(metabuf),
                                (void*)bodybuf, strlen(bodybuf));
        fdb_set(db1, doc[i]);
    }
    fdb_commit(dbfile1, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // open second writer
    fdb_open(&dbfile2, "dummy1", &fconfig);
    fdb_kvs_open(dbfile2, &db2, NULL, &kvs_config);

    for (i=0;i<n/2;++i){
        sprintf(metabuf, "meta2%d", i);
        sprintf(bodybuf, "body2%d(db2)", i);
        fdb_doc_update(&doc[i], (void *)metabuf, strlen(metabuf),
            (void *)bodybuf, strlen(bodybuf));
        fdb_set(db2, doc[i]);
    }
    for (i=n/2;i<n;++i){
        sprintf(metabuf, "meta2%d", i);
        sprintf(bodybuf, "body2%d(db1)", i);
        fdb_doc_update(&doc[i], (void *)metabuf, strlen(metabuf),
            (void *)bodybuf, strlen(bodybuf));
        fdb_set(db1, doc[i]);
    }

    // retrieve before commit
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta2%d", i);
        if (i < n/2) {
            sprintf(bodybuf, "body2%d(db2)", i);
        } else {
            sprintf(bodybuf, "body2%d(db1)", i);
        }
        // retrieve through db1
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf),
                                NULL, 0, NULL, 0);
        status = fdb_get(db1, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(metabuf, rdoc->meta, rdoc->metalen);
        TEST_CMP(bodybuf, rdoc->body, rdoc->bodylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;

        // retrieve through db2
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf),
                                NULL, 0, NULL, 0);
        status = fdb_get(db2, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(metabuf, rdoc->meta, rdoc->metalen);
        TEST_CMP(bodybuf, rdoc->body, rdoc->bodylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    fdb_commit(dbfile1, FDB_COMMIT_NORMAL);
    fdb_commit(dbfile2, FDB_COMMIT_NORMAL);

    // retrieve after commit
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta2%d", i);
        if (i < n/2) {
            sprintf(bodybuf, "body2%d(db2)", i);
        } else {
            sprintf(bodybuf, "body2%d(db1)", i);
        }
        // retrieve through db1
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf),
                                NULL, 0, NULL, 0);
        status = fdb_get(db1, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(metabuf, rdoc->meta, rdoc->metalen);
        TEST_CMP(bodybuf, rdoc->body, rdoc->bodylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;

        // retrieve through db2
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf),
                                NULL, 0, NULL, 0);
        status = fdb_get(db2, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(metabuf, rdoc->meta, rdoc->metalen);
        TEST_CMP(bodybuf, rdoc->body, rdoc->bodylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // close db file
    fdb_close(dbfile1);
    fdb_close(dbfile2);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("flush before commit with multi writers test");
}